

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_token>
          (xr_writer *this,undefined8 *container)

{
  xr_token *pxVar1;
  xr_token *t;
  write_token local_21;
  
  pxVar1 = (xr_token *)container[1];
  for (t = (xr_token *)*container; t != pxVar1; t = t + 1) {
    write_token::operator()(&local_21,t,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}